

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O3

void Omega_h::transfer_conserve_refine
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,LOs *keys2edges,LOs *keys2prods,
               LOs *prods2new_ents,LOs *same_ents2old_ents,LOs *same_ents2new_ents)

{
  int *piVar1;
  OpConservation op_conservation;
  undefined8 uVar2;
  Alloc *pAVar3;
  Alloc *this;
  bool bVar4;
  long lVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  Cavs init_cavs;
  CavsByBdryStatus cavs;
  undefined4 uVar8;
  undefined3 uVar9;
  undefined4 uStack_1f4;
  undefined1 local_1e8 [24];
  pointer local_1d0;
  LOs local_1c8;
  LOs local_1b8;
  LOs local_1a8;
  LOs local_198;
  Cavs local_188;
  Cavs local_148;
  
  uVar8 = SUB84(old_mesh,0);
  uStack_1f4 = (undefined4)((ulong)old_mesh >> 0x20);
  bVar4 = should_conserve_any(old_mesh,opts);
  if (bVar4) {
    local_1c8.write_.shared_alloc_.alloc = (keys2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_1c8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1c8.write_.shared_alloc_.alloc =
             (Alloc *)((local_1c8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1c8.write_.shared_alloc_.alloc)->use_count =
             (local_1c8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar3 = local_1c8.write_.shared_alloc_.alloc;
    local_1c8.write_.shared_alloc_.direct_ptr = (keys2edges->write_).shared_alloc_.direct_ptr;
    local_1e8._16_8_ = (keys2prods->write_).shared_alloc_.alloc;
    if ((local_1e8._16_8_ & 7) == 0 && (Alloc *)local_1e8._16_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1e8._16_8_ = ((Alloc *)local_1e8._16_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_1e8._16_8_)->use_count = ((Alloc *)local_1e8._16_8_)->use_count + 1;
      }
    }
    uVar2 = local_1e8._16_8_;
    local_1d0 = (pointer)(keys2prods->write_).shared_alloc_.direct_ptr;
    local_198.write_.shared_alloc_.alloc = (prods2new_ents->write_).shared_alloc_.alloc;
    if (((ulong)local_198.write_.shared_alloc_.alloc & 7) == 0 &&
        local_198.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_198.write_.shared_alloc_.alloc =
             (Alloc *)((local_198.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_198.write_.shared_alloc_.alloc)->use_count =
             (local_198.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    this = local_198.write_.shared_alloc_.alloc;
    local_198.write_.shared_alloc_.direct_ptr = (prods2new_ents->write_).shared_alloc_.direct_ptr;
    form_initial_cavs(&local_148,(Mesh *)CONCAT44(uStack_1f4,uVar8),
                      (Mesh *)(ulong)(uint)new_mesh->dim_,1,&local_1c8,(LOs *)(local_1e8 + 0x10),
                      &local_198);
    if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
      piVar1 = &this->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(this);
        operator_delete(this,0x48);
      }
    }
    if ((uVar2 & 7) == 0 && (Alloc *)uVar2 != (Alloc *)0x0) {
      piVar1 = (int *)(uVar2 + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)uVar2);
        operator_delete((void *)uVar2,0x48);
      }
    }
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    local_188.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
         local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.keys2old_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_148.keys2old_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_188.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr =
         local_148.keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr;
    local_188.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
         local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.keys2old_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_148.keys2old_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_188.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr =
         local_148.keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr;
    local_188.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
         local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.keys2new_elems.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_148.keys2new_elems.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_188.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr =
         local_148.keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr;
    local_188.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
         local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.keys2new_elems.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_148.keys2new_elems.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_188.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
         local_148.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr;
    local_1a8.write_.shared_alloc_.alloc = (keys2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_1a8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1a8.write_.shared_alloc_.alloc =
             (Alloc *)((local_1a8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1a8.write_.shared_alloc_.alloc)->use_count =
             (local_1a8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar3 = local_1a8.write_.shared_alloc_.alloc;
    local_1a8.write_.shared_alloc_.direct_ptr = (keys2edges->write_).shared_alloc_.direct_ptr;
    separate_cavities((CavsByBdryStatus *)&stack0xfffffffffffffef8,
                      (Mesh *)CONCAT44(uStack_1f4,uVar8),new_mesh,&local_188,1,&local_1a8,
                      (Graph *)0x0);
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    Cavs::~Cavs(&local_188);
    local_1e8._0_8_ = (same_ents2old_ents->write_).shared_alloc_.alloc;
    if ((local_1e8._0_8_ & 7) == 0 && (Alloc *)local_1e8._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1e8._0_8_ = ((Alloc *)local_1e8._0_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_1e8._0_8_)->use_count = ((Alloc *)local_1e8._0_8_)->use_count + 1;
      }
    }
    uVar2 = local_1e8._0_8_;
    local_1e8._8_8_ = (same_ents2old_ents->write_).shared_alloc_.direct_ptr;
    local_1b8.write_.shared_alloc_.alloc = (same_ents2new_ents->write_).shared_alloc_.alloc;
    if (((ulong)local_1b8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_1b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1b8.write_.shared_alloc_.alloc =
             (Alloc *)((local_1b8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1b8.write_.shared_alloc_.alloc)->use_count =
             (local_1b8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar3 = local_1b8.write_.shared_alloc_.alloc;
    local_1b8.write_.shared_alloc_.direct_ptr =
         (same_ents2new_ents->write_).shared_alloc_.direct_ptr;
    uVar9 = (undefined3)((uint)uVar8 >> 8);
    op_conservation.momentum.this_time._M_elems[2] = (bool)(char)uVar8;
    op_conservation.momentum.always._M_elems[0] = (bool)(char)uVar9;
    op_conservation.momentum.always._M_elems[1] = (bool)(char)((uint3)uVar9 >> 8);
    op_conservation.momentum.always._M_elems[2] = (bool)(char)((uint3)uVar9 >> 0x10);
    op_conservation.density.this_time._M_elems[0] = true;
    op_conservation.density.this_time._M_elems[1] = true;
    op_conservation.density.this_time._M_elems[2] = true;
    op_conservation.density.always._M_elems[0] = false;
    op_conservation.density.always._M_elems[1] = false;
    op_conservation.density.always._M_elems[2] = false;
    op_conservation.momentum.this_time._M_elems[0] = false;
    op_conservation.momentum.this_time._M_elems[1] = false;
    transfer_conservation_errors
              ((Omega_h *)CONCAT44(uStack_1f4,uVar8),(Mesh *)opts,(TransferOpts *)new_mesh,
               (Mesh *)&stack0xfffffffffffffef8,(CavsByBdryStatus *)local_1e8,&local_1b8,
               (LOs *)0x1010101,op_conservation);
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    if ((uVar2 & 7) == 0 && (Alloc *)uVar2 != (Alloc *)0x0) {
      piVar1 = (int *)(uVar2 + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)uVar2);
        operator_delete((void *)uVar2,0x48);
      }
    }
    puVar6 = &stack0xffffffffffffffd0;
    puVar7 = &stack0xfffffffffffffef8;
    do {
      lVar5 = 0xc0;
      do {
        std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::~vector
                  ((vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_> *)(puVar7 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != 0x78);
      puVar6 = puVar6 + -0x48;
      puVar7 = puVar7 + -0x48;
    } while (puVar6 != &stack0xfffffffffffffef8);
    Cavs::~Cavs(&local_148);
  }
  return;
}

Assistant:

void transfer_conserve_refine(Mesh* old_mesh, TransferOpts const& opts,
    Mesh* new_mesh, LOs keys2edges, LOs keys2prods, LOs prods2new_ents,
    LOs same_ents2old_ents, LOs same_ents2new_ents) {
  if (!should_conserve_any(old_mesh, opts)) return;
  auto init_cavs = form_initial_cavs(
      old_mesh, new_mesh, EDGE, keys2edges, keys2prods, prods2new_ents);
  auto cavs =
      separate_cavities(old_mesh, new_mesh, init_cavs, EDGE, keys2edges);
  OpConservation op_conservation;
  op_conservation.density.this_time[NOT_BDRY] = true;
  op_conservation.density.this_time[TOUCH_BDRY] = true;
  op_conservation.density.this_time[KEY_BDRY] = true;
  op_conservation.momentum.this_time[NOT_BDRY] = true;
  op_conservation.momentum.this_time[TOUCH_BDRY] = true;
  op_conservation.momentum.this_time[KEY_BDRY] = true;
  transfer_conservation_errors(old_mesh, opts, new_mesh, cavs,
      same_ents2old_ents, same_ents2new_ents, op_conservation);
}